

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2contains_point_query.h
# Opt level: O2

bool __thiscall
S2ContainsPointQuery<S2ShapeIndex>::Contains(S2ContainsPointQuery<S2ShapeIndex> *this,S2Point *p)

{
  Iterator *it;
  uint uVar1;
  bool bVar2;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_00;
  const_reference clipped;
  int s;
  size_type_conflict n;
  bool bVar3;
  
  it = &this->it_;
  bVar2 = S2ShapeIndex::IteratorBase::LocateImpl<S2ShapeIndex::Iterator>(p,it);
  n = 0;
  bVar3 = false;
  if (bVar2) {
    this_00 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
              S2ShapeIndex::Iterator::cell(it);
    uVar1 = *(uint *)this_00;
    do {
      bVar2 = (uVar1 & 0xffffff) == n;
      bVar3 = !bVar2;
      if (bVar2) {
        return bVar3;
      }
      clipped = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                          (this_00,n);
      bVar2 = ShapeContains(this,it,clipped,p);
      n = n + 1;
    } while (!bVar2);
  }
  return bVar3;
}

Assistant:

bool S2ContainsPointQuery<IndexType>::Contains(const S2Point& p) {
  if (!it_.Locate(p)) return false;

  const S2ShapeIndexCell& cell = it_.cell();
  int num_clipped = cell.num_clipped();
  for (int s = 0; s < num_clipped; ++s) {
    if (ShapeContains(it_, cell.clipped(s), p)) return true;
  }
  return false;
}